

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

double __thiscall cmCTestRunTest::ResolveTimeout(cmCTestRunTest *this)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  pointer pcVar4;
  cmCTest *this_00;
  int iVar5;
  cmCTestRunTest *pcVar6;
  int iVar7;
  tm *ptVar8;
  time_t tVar9;
  time_t tVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  time_t current_time;
  ostringstream cmCTestLog_msg;
  char buf [1024];
  time_t local_5e0;
  cmCTestRunTest *local_5d8;
  long *local_5d0;
  long local_5c0 [2];
  long *local_5b0 [2];
  long local_5a0 [12];
  ios_base local_540 [264];
  long *local_438 [2];
  long local_428 [127];
  
  dVar1 = this->TestProperties->Timeout;
  pcVar4 = (this->CTest->StopTime)._M_dataplus._M_p;
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_438,pcVar4,pcVar4 + (this->CTest->StopTime)._M_string_length);
  iVar7 = std::__cxx11::string::compare((char *)local_438);
  if (local_438[0] != local_428) {
    operator_delete(local_438[0],local_428[0] + 1);
  }
  dVar12 = dVar1;
  if (iVar7 != 0) {
    local_5e0 = time((time_t *)0x0);
    ptVar8 = gmtime(&local_5e0);
    iVar7 = ptVar8->tm_hour;
    tVar9 = mktime(ptVar8);
    ptVar8 = localtime(&local_5e0);
    iVar2 = ptVar8->tm_hour;
    iVar11 = iVar2 - iVar7;
    if ((iVar11 == 0 || iVar2 < iVar7) || tVar9 <= local_5e0) {
      iVar5 = iVar11 + 0x18;
      if (iVar7 <= iVar2) {
        iVar5 = iVar11;
      }
      if (local_5e0 <= tVar9) {
        iVar5 = iVar11;
      }
    }
    else {
      iVar5 = iVar11 + -0x18;
    }
    iVar7 = ptVar8->tm_year;
    uVar3 = ptVar8->tm_mday;
    iVar2 = ptVar8->tm_mon;
    pcVar4 = (this->CTest->StopTime)._M_dataplus._M_p;
    local_5d8 = this;
    local_5b0[0] = local_5a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_5b0,pcVar4,pcVar4 + (this->CTest->StopTime)._M_string_length);
    sprintf((char *)local_438,"%d%02d%02d %s %+05i",(ulong)(iVar7 + 0x76c),(ulong)(iVar2 + 1),
            (ulong)uVar3,local_5b0[0],iVar5 * 100);
    if (local_5b0[0] != local_5a0) {
      operator_delete(local_5b0[0],local_5a0[0] + 1);
    }
    tVar10 = curl_getdate((char *)local_438,&local_5e0);
    pcVar6 = local_5d8;
    if (tVar10 != -1) {
      iVar7 = (int)tVar10 + 0x15180;
      if (local_5d8->CTest->NextDayStopTime == false) {
        iVar7 = (int)tVar10;
      }
      iVar7 = (iVar7 - (int)local_5e0) % 0x15180;
      local_5d8->CTest->LastStopTimeout = iVar7;
      if (iVar7 < 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5b0,"The stop time has been passed. Stopping all tests.",0x32);
        std::ios::widen((char)(ostringstream *)local_5b0 + (char)local_5b0[0][-3]);
        std::ostream::put((char)local_5b0);
        std::ostream::flush();
        this_00 = pcVar6->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x298,(char *)local_5d0,false);
        if (local_5d0 != local_5c0) {
          operator_delete(local_5d0,local_5c0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
        std::ios_base::~ios_base(local_540);
        pcVar6->StopTimePassed = true;
        dVar12 = 0.0;
      }
      else {
        dVar13 = (double)iVar7;
        if (((dVar1 != 0.0) || (dVar12 = dVar13, NAN(dVar1))) && (dVar12 = dVar1, dVar13 <= dVar1))
        {
          dVar12 = dVar13;
        }
      }
    }
  }
  return dVar12;
}

Assistant:

double cmCTestRunTest::ResolveTimeout()
{
  double timeout = this->TestProperties->Timeout;

  if (this->CTest->GetStopTime() == "") {
    return timeout;
  }
  struct tm* lctime;
  time_t current_time = time(CM_NULLPTR);
  lctime = gmtime(&current_time);
  int gm_hour = lctime->tm_hour;
  time_t gm_time = mktime(lctime);
  lctime = localtime(&current_time);
  int local_hour = lctime->tm_hour;

  int tzone_offset = local_hour - gm_hour;
  if (gm_time > current_time && gm_hour < local_hour) {
    // this means gm_time is on the next day
    tzone_offset -= 24;
  } else if (gm_time < current_time && gm_hour > local_hour) {
    // this means gm_time is on the previous day
    tzone_offset += 24;
  }

  tzone_offset *= 100;
  char buf[1024];
  // add todays year day and month to the time in str because
  // curl_getdate no longer assumes the day is today
  sprintf(buf, "%d%02d%02d %s %+05i", lctime->tm_year + 1900,
          lctime->tm_mon + 1, lctime->tm_mday,
          this->CTest->GetStopTime().c_str(), tzone_offset);

  time_t stop_time = curl_getdate(buf, &current_time);
  if (stop_time == -1) {
    return timeout;
  }

  // the stop time refers to the next day
  if (this->CTest->NextDayStopTime) {
    stop_time += 24 * 60 * 60;
  }
  int stop_timeout =
    static_cast<int>(stop_time - current_time) % (24 * 60 * 60);
  this->CTest->LastStopTimeout = stop_timeout;

  if (stop_timeout <= 0 || stop_timeout > this->CTest->LastStopTimeout) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "The stop time has been passed. "
                                           "Stopping all tests."
                 << std::endl);
    this->StopTimePassed = true;
    return 0;
  }
  return timeout == 0 ? stop_timeout
                      : (timeout < stop_timeout ? timeout : stop_timeout);
}